

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

vm_obj_id_t CVmObjStringConst::create(char *const_ptr)

{
  vm_obj_id_t vVar1;
  vm_obj_id_t id;
  undefined4 in_stack_ffffffffffffffe8;
  vm_obj_id_t in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  vVar1 = vm_new_id(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  CVmObject::operator_new(CONCAT44(vVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  CVmObjStringConst((CVmObjStringConst *)CONCAT44(vVar1,in_stack_fffffffffffffff0),
                    (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjStringConst::create(VMG_ const char *const_ptr)
{
    /* create our new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create our string object, pointing directly to the constant pool */
    new (vmg_ id) CVmObjStringConst(vmg_ const_ptr);

    /* return the new ID */
    return id;
}